

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

double average_time<std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                 (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *generator,
                 size_t trials,size_t times)

{
  long lVar1;
  long in_RDX;
  ulong in_RSI;
  double dVar2;
  undefined1 auVar3 [16];
  timer elapsed;
  size_t i;
  double average_time;
  timer *in_stack_ffffffffffffffd0;
  ulong times_00;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *generator_00;
  
  generator_00 = (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)0x0;
  for (times_00 = 0; times_00 < in_RSI; times_00 = times_00 + 1) {
    timer::timer(in_stack_ffffffffffffffd0);
    single_run<std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
              (generator_00,times_00);
    dVar2 = timer::elapsed((timer *)generator_00);
    generator_00 = (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                   (dVar2 + (double)generator_00);
  }
  lVar1 = in_RSI * in_RDX;
  auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar3._0_8_ = lVar1;
  auVar3._12_4_ = 0x45300000;
  return (((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / (double)generator_00) /
         1000000.0;
}

Assistant:

double average_time(G& generator, size_t trials, size_t times ) {
    double average_time = 0.0;

    for ( size_t i = 0; i < trials; ++i ) {
        timer elapsed;
        single_run( generator, times );
        average_time += elapsed.elapsed();
    }

    return trials * times / average_time / 1000000.0;
}